

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O1

void __thiscall Simulator::pop_identity(Simulator *this,PCode *code)

{
  Symbol *pSVar1;
  simulator_error *psVar2;
  int iVar3;
  _Elt_pointer pSVar4;
  double dVar5;
  StackSymbol back;
  int local_94;
  string local_90;
  Type local_70;
  int local_68;
  vector<int,_std::allocator<int>_> local_60;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  
  pSVar4 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar4 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar4 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  local_70 = pSVar4[-1].type_;
  local_68 = pSVar4[-1].value_.int_value;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,&pSVar4[-1].value_.int_array);
  local_48 = pSVar4[-1].value_.real_value;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,&pSVar4[-1].value_.real_array);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  pSVar1 = ScopeTree::resolve(&this->tree_,&code->first_);
  if (pSVar1->type_ == kReal) {
    dVar5 = local_48;
    if (local_70 != kReal) {
      if (local_70 != kInt) {
        psVar2 = (simulator_error *)__cxa_allocate_exception(0x30);
        local_94 = this->eip_;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,anon_var_dwarf_af42,anon_var_dwarf_af42 + 0x18);
        simulator_error::simulator_error(psVar2,&local_94,&local_90);
        __cxa_throw(psVar2,&simulator_error::typeinfo,simulator_error::~simulator_error);
      }
      dVar5 = (double)local_68;
    }
    (pSVar1->value_).real_value = dVar5;
  }
  else {
    if (pSVar1->type_ != kInt) {
      psVar2 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_94 = this->eip_;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,anon_var_dwarf_af5c,anon_var_dwarf_af5c + 0x15);
      simulator_error::simulator_error(psVar2,&local_94,&local_90);
      __cxa_throw(psVar2,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    if (local_70 == kReal) {
      iVar3 = (int)local_48;
    }
    else {
      iVar3 = local_68;
      if (local_70 != kInt) {
        psVar2 = (simulator_error *)__cxa_allocate_exception(0x30);
        local_94 = this->eip_;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,anon_var_dwarf_af42,anon_var_dwarf_af42 + 0x18);
        simulator_error::simulator_error(psVar2,&local_94,&local_90);
        __cxa_throw(psVar2,&simulator_error::typeinfo,simulator_error::~simulator_error);
      }
    }
    (pSVar1->value_).int_value = iVar3;
  }
  pSVar1->is_assigned_ = true;
  this->eip_ = this->eip_ + 1;
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Simulator::pop_identity(const PCode &code) {
    StackSymbol back = stack_.back();
    stack_.pop_back();
    Symbol &symbol = tree_.resolve(code.first());

    if (symbol.type() == Symbol::Type::kInt) {
        if (back.type() == StackSymbol::Type::kInt) {
            symbol.set_value((int) back.int_value());
        } else if (back.type() == StackSymbol::Type::kReal) {
            symbol.set_value((int) back.real_value());
        } else {
            throw simulator_error(eip(), "无法取出栈顶元素");
        }
    } else if (symbol.type() == Symbol::Type::kReal) {
        if (back.type() == StackSymbol::Type::kInt) {
            symbol.set_value((double) back.int_value());
        } else if (back.type() == StackSymbol::Type::kReal) {
            symbol.set_value((double) back.real_value());
        } else {
            throw simulator_error(eip(), "无法取出栈顶元素");
        }
    } else {
        throw simulator_error(eip(), "错误的目标类型");
    }

    symbol.set_assigned();

    inc_eip();
}